

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O1

uint64_t __thiscall cubeb_client::get_stream_position(cubeb_client *this)

{
  int iVar1;
  uint64_t pos;
  uint64_t local_8;
  
  local_8 = 0;
  iVar1 = cubeb_stream_get_position(this->stream,&local_8);
  if (iVar1 != 0) {
    get_stream_position();
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t cubeb_client::get_stream_position() const {
  uint64_t pos = 0;
  int rv = cubeb_stream_get_position(stream, &pos);
  if (rv != CUBEB_OK) {
    fprintf(stderr, "Could not get the position of the stream\n");
    return 0;
  }
  return pos;
}